

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeEventPoolGetContextHandle
          (ze_event_pool_handle_t hEventPool,ze_context_handle_t *phContext)

{
  ze_result_t zVar1;
  
  if (DAT_0010e560 != (code *)0x0) {
    zVar1 = (*DAT_0010e560)();
    return zVar1;
  }
  context_t::get()::count = (ze_context_handle_t)((long)context_t::get()::count + 1);
  *phContext = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolGetContextHandle(
        ze_event_pool_handle_t hEventPool,              ///< [in] handle of the event pool
        ze_context_handle_t* phContext                  ///< [out] handle of the context on which the event pool was created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetContextHandle = context.zeDdiTable.EventPool.pfnGetContextHandle;
        if( nullptr != pfnGetContextHandle )
        {
            result = pfnGetContextHandle( hEventPool, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }